

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_teleport.cpp
# Opt level: O0

bool EV_Teleport(int tid,int tag,line_t *line,int side,AActor *thing,int flags)

{
  bool bVar1;
  uint uVar2;
  AActor *this;
  PClass *base;
  bool local_111;
  TAngle<double> local_110;
  TAngle<double> local_108;
  TAngle<double> local_100;
  DVector3 local_f8;
  TVector2<double> local_e0;
  TVector3<double> local_d0;
  TAngle<double> local_b8;
  TAngle<double> local_b0;
  undefined1 local_a8 [40];
  TFlags<ActorFlag2,_unsigned_int> local_80;
  bool local_79;
  bool predicting;
  DAngle badangle;
  double vy;
  double vx;
  double c;
  double s;
  DAngle angle;
  double z;
  AActor *searcher;
  int flags_local;
  AActor *thing_local;
  int side_local;
  line_t *line_local;
  int tag_local;
  int tid_local;
  
  TAngle<double>::TAngle((TAngle<double> *)&s,0.0);
  c = 0.0;
  vx = 0.0;
  vy = 0.0;
  badangle.Degrees = 0.0;
  TAngle<double>::TAngle((TAngle<double> *)&stack0xffffffffffffff88,0.0);
  if (thing == (AActor *)0x0) {
    tag_local._3_1_ = false;
  }
  else {
    local_111 = false;
    if (thing->player != (player_t *)0x0) {
      local_111 = (thing->player->cheats & 0x2000U) != 0;
    }
    local_79 = local_111;
    TFlags<ActorFlag2,_unsigned_int>::operator&
              (&local_80,(int)thing + (MF2_RIP|MF2_NOTELEPORT|MF2_FLY));
    uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_80);
    if (uVar2 == 0) {
      if (side == 0) {
        this = SelectTeleDest(tid,tag,(bool)(local_79 & 1));
        if (this == (AActor *)0x0) {
          tag_local._3_1_ = false;
        }
        else {
          if (((flags & 0x60U) == 0) || (line == (line_t *)0x0)) {
            base = PClass::FindClass(NAME_TeleportDest2);
            bVar1 = DObject::IsKindOf((DObject *)this,base);
            if (bVar1) {
              angle.Degrees = AActor::Z(this);
            }
            else {
              angle.Degrees = -2147483648.0;
            }
          }
          else {
            line_t::Delta((line_t *)local_a8);
            TVector2<double>::Angle((TVector2<double> *)(local_a8 + 0x10));
            TAngle<double>::TAngle(&local_b0,&(this->Angles).Yaw);
            TAngle<double>::operator-
                      ((TAngle<double> *)(local_a8 + 0x18),(TAngle<double> *)(local_a8 + 0x10));
            TAngle<double>::operator+((TAngle<double> *)(local_a8 + 0x20),90.0);
            TAngle<double>::operator=((TAngle<double> *)&s,(TAngle<double> *)(local_a8 + 0x20));
            if ((flags & 0x40U) != 0) {
              TAngle<double>::operator-(&local_b8);
              TAngle<double>::operator=((TAngle<double> *)&s,&local_b8);
            }
            c = TAngle<double>::Sin((TAngle<double> *)&s);
            vx = TAngle<double>::Cos((TAngle<double> *)&s);
            vy = (thing->Vel).X;
            badangle.Degrees = (thing->Vel).Y;
            angle.Degrees = AActor::Z(this);
          }
          if (((i_compatflags2 & 1U) != 0) && (thing->player != (player_t *)0x0)) {
            TAngle<double>::operator=((TAngle<double> *)&stack0xffffffffffffff88,0.01);
          }
          AActor::Pos(&local_f8,this);
          TVector2<double>::TVector2(&local_e0,&local_f8);
          TVector3<double>::TVector3(&local_d0,&local_e0,angle.Degrees);
          TAngle<double>::TAngle(&local_108,(TAngle<double> *)&stack0xffffffffffffff88);
          TAngle<double>::operator+(&local_100,&(this->Angles).Yaw);
          bVar1 = P_Teleport(thing,&local_d0,&local_100,flags);
          if (bVar1) {
            if ((line != (line_t *)0x0) && ((flags & 0x60U) != 0)) {
              TAngle<double>::TAngle(&local_110,(TAngle<double> *)&s);
              TAngle<double>::operator+=(&(thing->Angles).Yaw,&local_110);
              (thing->Vel).X = vy * vx - badangle.Degrees * c;
              (thing->Vel).Y = badangle.Degrees * vx + vy * c;
            }
            if ((((vy == 0.0) && (!NAN(vy))) && (badangle.Degrees == 0.0)) &&
               (((!NAN(badangle.Degrees) && (thing->player != (player_t *)0x0)) &&
                ((thing->player->mo == (APlayerPawn *)thing && ((local_79 & 1U) == 0)))))) {
              (*(thing->player->mo->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x25])
                        ();
            }
            tag_local._3_1_ = true;
          }
          else {
            tag_local._3_1_ = false;
          }
        }
      }
      else {
        tag_local._3_1_ = false;
      }
    }
    else {
      tag_local._3_1_ = false;
    }
  }
  return tag_local._3_1_;
}

Assistant:

bool EV_Teleport (int tid, int tag, line_t *line, int side, AActor *thing, int flags)
{
	AActor *searcher;
	double z;
	DAngle angle = 0.;
	double s = 0, c = 0;
	double vx = 0, vy = 0;
	DAngle badangle = 0.;

	if (thing == NULL)
	{ // Teleport function called with an invalid actor
		return false;
	}
	bool predicting = (thing->player && (thing->player->cheats & CF_PREDICTING));
	if (thing->flags2 & MF2_NOTELEPORT)
	{
		return false;
	}
	if (side != 0)
	{ // Don't teleport if hit back of line, so you can get out of teleporter.
		return 0;
	}
	searcher = SelectTeleDest(tid, tag, predicting);
	if (searcher == NULL)
	{
		return false;
	}
	// [RH] Lee Killough's changes for silent teleporters from BOOM
	if ((flags & (TELF_ROTATEBOOM|TELF_ROTATEBOOMINVERSE)) && line)
	{
		// Get the angle between the exit thing and source linedef.
		// Rotate 90 degrees, so that walking perpendicularly across
		// teleporter linedef causes thing to exit in the direction
		// indicated by the exit thing.
		angle = line->Delta().Angle() - searcher->Angles.Yaw + 90.;
		if (flags & TELF_ROTATEBOOMINVERSE) angle = -angle;

		// Sine, cosine of angle adjustment
		s = angle.Sin();
		c = angle.Cos();

		// Velocity of thing crossing teleporter linedef
		vx = thing->Vel.X;
		vy = thing->Vel.Y;

		z = searcher->Z();
	}
	else if (searcher->IsKindOf (PClass::FindClass(NAME_TeleportDest2)))
	{
		z = searcher->Z();
	}
	else
	{
		z = ONFLOORZ;
	}
	if ((i_compatflags2 & COMPATF2_BADANGLES) && (thing->player != NULL))
	{
		badangle = 0.01;
	}
	if (P_Teleport (thing, DVector3(searcher->Pos(), z), searcher->Angles.Yaw + badangle, flags))
	{
		// [RH] Lee Killough's changes for silent teleporters from BOOM
		if (line)
		{
			if (flags & (TELF_ROTATEBOOM| TELF_ROTATEBOOMINVERSE))
			{
				// Rotate thing according to difference in angles (or not - Boom got the direction wrong here.)
				thing->Angles.Yaw += angle;

				// Rotate thing's velocity to come out of exit just like it entered
				thing->Vel.X = vx*c - vy*s;
				thing->Vel.Y = vy*c + vx*s;
			}
		}
		if (vx == 0 && vy == 0 && thing->player != NULL && thing->player->mo == thing && !predicting)
		{
			thing->player->mo->PlayIdle ();
		}
		return true;
	}
	return false;
}